

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall SolverTest_StrOptions_Test::TestBody(SolverTest_StrOptions_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char ***pppcVar5;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  TestSolverWithOptions s;
  ASLProblem *p;
  undefined4 in_stack_fffffffffffffba0;
  uint in_stack_fffffffffffffba4;
  char (*in_stack_fffffffffffffba8) [4];
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  char *in_stack_fffffffffffffbb8;
  int line;
  undefined5 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc5;
  undefined1 in_stack_fffffffffffffbc6;
  undefined1 in_stack_fffffffffffffbc7;
  char *in_stack_fffffffffffffbc8;
  Type type;
  AssertHelper *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  Args *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbf0;
  char *in_stack_fffffffffffffc00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc08;
  char *in_stack_fffffffffffffc10;
  AssertionResult *in_stack_fffffffffffffc18;
  AssertHelper *in_stack_fffffffffffffc20;
  AssertionResult local_370 [6];
  TestSolverWithOptions *in_stack_fffffffffffffcf0;
  
  TestSolverWithOptions::TestSolverWithOptions(in_stack_fffffffffffffcf0);
  p = (ASLProblem *)0x0;
  Args::Args(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbc8,
             (char *)CONCAT17(in_stack_fffffffffffffbc7,
                              CONCAT16(in_stack_fffffffffffffbc6,
                                       CONCAT15(in_stack_fffffffffffffbc5,in_stack_fffffffffffffbc0)
                                      )),in_stack_fffffffffffffbb8,in_stack_fffffffffffffbf0);
  pppcVar5 = Args::operator_cast_to_char___
                       ((Args *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
  type = (Type)((ulong)pppcVar5 >> 0x20);
  uVar1 = TestSolverWithOptions::ParseOptions
                    ((TestSolverWithOptions *)
                     CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                     (char **)in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,p);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             SUB81((ulong)p >> 0x38,0));
  Args::~Args((Args *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               (char *)in_stack_fffffffffffffc08.ptr_,in_stack_fffffffffffffc00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbd0,type,
               (char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffbc5,
                                                              in_stack_fffffffffffffbc0))),
               (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,(Message *)in_stack_fffffffffffffc18);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc10);
    testing::Message::~Message((Message *)0x1475e6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14765b);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffffbb8,
             (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
             in_stack_fffffffffffffba8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  uVar3 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffc00);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    in_stack_fffffffffffffbb8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1476e4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbd0,type,
               (char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,in_stack_fffffffffffffbc0))),
               (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,(Message *)in_stack_fffffffffffffc18);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    testing::Message::~Message((Message *)0x147732);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14777e);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffffbb8,
             (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
             in_stack_fffffffffffffba8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  line = (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  uVar4 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffbe0);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x147804);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbd0,type,
               (char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,in_stack_fffffffffffffbc0))),
               line,(char *)CONCAT17(uVar4,in_stack_fffffffffffffbb0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,(Message *)in_stack_fffffffffffffc18);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    testing::Message::~Message((Message *)0x147852);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14789e);
  TestSolverWithOptions::~TestSolverWithOptions
            ((TestSolverWithOptions *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0))
  ;
  return;
}

Assistant:

TEST(SolverTest, StrOptions) {
  TestSolverWithOptions s;
  EXPECT_TRUE(s.ParseOptions(Args("stropt1=abc", "stropt2=def")));
  EXPECT_EQ("abc", s.stropt1);
  EXPECT_EQ("def", s.stropt2);
}